

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

IVec2 __thiscall
vkt::memory::anon_unknown_0::findMaxRGBA8ImageSize
          (anon_unknown_0 *this,DeviceInterface *vkd,VkDevice device,VkImageUsageFlags usage,
          VkSharingMode sharingMode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies,VkDeviceSize memorySize
          ,deUint32 memoryTypeIndex)

{
  RefData<vk::Handle<(vk::HandleType)9>_> data;
  uint b;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 *pdVar3;
  VkImageLayout *pVVar4;
  int *piVar5;
  Handle<(vk::HandleType)9> *pHVar6;
  float fVar7;
  undefined1 local_128 [8];
  VkMemoryRequirements requirements;
  Move<vk::Handle<(vk::HandleType)9>_> local_100;
  RefData<vk::Handle<(vk::HandleType)9>_> local_e0;
  undefined1 local_c0 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> image;
  VkImageCreateInfo createInfo;
  deInt32 stepSize;
  deUint32 height;
  deUint32 width;
  deUint32 texelCount;
  IVec2 currentSize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies_local;
  VkSharingMode sharingMode_local;
  VkImageUsageFlags usage_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  IVec2 *lastSuccess;
  
  currentSize.m_data = (int  [2])queueFamilies;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&width);
  fVar7 = deFloatSqrt((float)(memorySize >> 2 & 0xffffffff));
  dVar2 = (deUint32)(long)fVar7;
  b = (uint)(memorySize >> 2) / dVar2;
  dVar1 = deMaxu32(dVar2,b);
  pdVar3 = (deUint32 *)tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,0);
  *pdVar3 = dVar1;
  dVar2 = deMinu32(dVar2,b);
  pdVar3 = (deUint32 *)tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,1);
  *pdVar3 = dVar2;
  pVVar4 = (VkImageLayout *)tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,0);
  createInfo.initialLayout = *pVVar4;
  do {
    createInfo.initialLayout = (int)createInfo.initialLayout / 2;
    piVar5 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,0);
    if (*piVar5 < 1) {
      return (IVec2)(int  [2])this;
    }
    image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator._0_4_ = 0xe;
    tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,0);
    tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)currentSize.m_data);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)currentSize.m_data,0);
    ::vk::createImage(&local_100,vkd,device,
                      (VkImageCreateInfo *)
                      &image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                       m_allocator,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
    data.deleter.m_deviceIface = local_e0.deleter.m_deviceIface;
    data.object.m_internal = local_e0.object.m_internal;
    data.deleter.m_device = local_e0.deleter.m_device;
    data.deleter.m_allocator = local_e0.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_c0,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_100);
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_c0);
    ::vk::getImageMemoryRequirements
              ((VkMemoryRequirements *)local_128,vkd,device,(VkImage)pHVar6->m_internal);
    if ((memorySize < (ulong)local_128) ||
       (((uint)requirements.alignment & 1 << ((byte)memoryTypeIndex & 0x1f)) == 0)) {
      piVar5 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,0);
      *piVar5 = *piVar5 - createInfo.initialLayout;
      piVar5 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,1);
      *piVar5 = *piVar5 - createInfo.initialLayout;
    }
    else {
      *(int (*) [2])this = _width;
      piVar5 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,0);
      *piVar5 = *piVar5 + createInfo.initialLayout;
      piVar5 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&width,1);
      *piVar5 = createInfo.initialLayout + *piVar5;
    }
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_c0);
  } while (createInfo.initialLayout != VK_IMAGE_LAYOUT_UNDEFINED);
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 findMaxRGBA8ImageSize (const vk::DeviceInterface&	vkd,
							 vk::VkDevice				device,

							 vk::VkImageUsageFlags		usage,
							 vk::VkSharingMode			sharingMode,
							 const vector<deUint32>&	queueFamilies,

							 vk::VkDeviceSize			memorySize,
							 deUint32					memoryTypeIndex)
{
	IVec2		lastSuccess		(0);
	IVec2		currentSize;

	{
		const deUint32	texelCount	= (deUint32)(memorySize / 4);
		const deUint32	width		= (deUint32)deFloatSqrt((float)texelCount);
		const deUint32	height		= texelCount / width;

		currentSize[0] = deMaxu32(width, height);
		currentSize[1] = deMinu32(width, height);
	}

	for (deInt32 stepSize = currentSize[0] / 2; currentSize[0] > 0; stepSize /= 2)
	{
		const vk::VkImageCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,

			0u,
			vk::VK_IMAGE_TYPE_2D,
			vk::VK_FORMAT_R8G8B8A8_UNORM,
			{
				(deUint32)currentSize[0],
				(deUint32)currentSize[1],
				1u,
			},
			1u, 1u,
			vk::VK_SAMPLE_COUNT_1_BIT,
			vk::VK_IMAGE_TILING_OPTIMAL,
			usage,
			sharingMode,
			(deUint32)queueFamilies.size(),
			&queueFamilies[0],
			vk::VK_IMAGE_LAYOUT_UNDEFINED
		};
		const vk::Unique<vk::VkImage>	image			(vk::createImage(vkd, device, &createInfo));
		const vk::VkMemoryRequirements	requirements	(vk::getImageMemoryRequirements(vkd, device, *image));

		if (requirements.size <= memorySize && requirements.memoryTypeBits & (0x1u << memoryTypeIndex))
		{
			lastSuccess = currentSize;
			currentSize[0] += stepSize;
			currentSize[1] += stepSize;
		}
		else
		{
			currentSize[0] -= stepSize;
			currentSize[1] -= stepSize;
		}

		if (stepSize == 0)
			break;
	}

	return lastSuccess;
}